

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

Vec_Ptr_t * Io_ReadBlifGetTokens(Io_ReadBlif_t *p)

{
  Vec_Ptr_t *pVVar1;
  size_t sVar2;
  char *pcVar3;
  void *pvVar4;
  int local_2c;
  int i;
  char *pLastToken;
  Vec_Ptr_t *vTokens;
  Io_ReadBlif_t *p_local;
  
  if (0 < p->vNewTokens->nSize) {
    for (local_2c = 0; local_2c < p->vNewTokens->nSize; local_2c = local_2c + 1) {
      if (p->vNewTokens->pArray[local_2c] != (void *)0x0) {
        free(p->vNewTokens->pArray[local_2c]);
        p->vNewTokens->pArray[local_2c] = (void *)0x0;
      }
    }
    p->vNewTokens->nSize = 0;
  }
  p_local = (Io_ReadBlif_t *)Extra_FileReaderGetTokens(p->pReader);
  if (p_local != (Io_ReadBlif_t *)0x0) {
    pcVar3 = *(char **)(p_local->pReader->pCharMap +
                       (long)(*(int *)((long)&p_local->pFileName + 4) + -1) * 8 + -0x18);
    sVar2 = strlen(pcVar3);
    if (pcVar3[sVar2 - 1] == '\\') {
      sVar2 = strlen(pcVar3);
      pcVar3[sVar2 - 1] = '\0';
      if (*pcVar3 == '\0') {
        *(int *)((long)&p_local->pFileName + 4) = *(int *)((long)&p_local->pFileName + 4) + -1;
      }
      for (local_2c = 0; local_2c < *(int *)((long)&p_local->pFileName + 4); local_2c = local_2c + 1
          ) {
        pVVar1 = p->vNewTokens;
        pcVar3 = Extra_UtilStrsav(*(char **)(p_local->pReader->pCharMap + (long)local_2c * 8 + -0x18
                                            ));
        Vec_PtrPush(pVVar1,pcVar3);
      }
      while (pvVar4 = Extra_FileReaderGetTokens(p->pReader), *(int *)((long)pvVar4 + 4) != 0) {
        pcVar3 = *(char **)(*(long *)((long)pvVar4 + 8) +
                           (long)(*(int *)((long)pvVar4 + 4) + -1) * 8);
        sVar2 = strlen(pcVar3);
        if (pcVar3[sVar2 - 1] != '\\') {
          for (local_2c = 0; local_2c < *(int *)((long)pvVar4 + 4); local_2c = local_2c + 1) {
            pVVar1 = p->vNewTokens;
            pcVar3 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar4 + 8) + (long)local_2c * 8));
            Vec_PtrPush(pVVar1,pcVar3);
          }
          return p->vNewTokens;
        }
        sVar2 = strlen(pcVar3);
        pcVar3[sVar2 - 1] = '\0';
        if (*pcVar3 == '\0') {
          *(int *)((long)pvVar4 + 4) = *(int *)((long)pvVar4 + 4) + -1;
        }
        for (local_2c = 0; local_2c < *(int *)((long)pvVar4 + 4); local_2c = local_2c + 1) {
          pVVar1 = p->vNewTokens;
          pcVar3 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar4 + 8) + (long)local_2c * 8));
          Vec_PtrPush(pVVar1,pcVar3);
        }
      }
      p_local = (Io_ReadBlif_t *)p->vNewTokens;
    }
  }
  return (Vec_Ptr_t *)p_local;
}

Assistant:

Vec_Ptr_t * Io_ReadBlifGetTokens( Io_ReadBlif_t * p )
{
    Vec_Ptr_t * vTokens;
    char * pLastToken;
    int i;

    // get rid of the old tokens
    if ( p->vNewTokens->nSize > 0 )
    {
        for ( i = 0; i < p->vNewTokens->nSize; i++ )
            ABC_FREE( p->vNewTokens->pArray[i] );
        p->vNewTokens->nSize = 0;
    }

    // get the new tokens
    vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
    if ( vTokens == NULL )
        return vTokens;

    // check if there is a transfer to another line
    pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
    if ( pLastToken[ strlen(pLastToken)-1 ] != '\\' )
        return vTokens;

    // remove the slash
    pLastToken[ strlen(pLastToken)-1 ] = 0;
    if ( pLastToken[0] == 0 )
        vTokens->nSize--;
    // load them into the new array
    for ( i = 0; i < vTokens->nSize; i++ )
        Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );

    // load as long as there is the line break
    while ( 1 )
    {
        // get the new tokens
        vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
        if ( vTokens->nSize == 0 )
            return p->vNewTokens;
        // check if there is a transfer to another line
        pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
        if ( pLastToken[ strlen(pLastToken)-1 ] == '\\' )
        {
            // remove the slash
            pLastToken[ strlen(pLastToken)-1 ] = 0;
            if ( pLastToken[0] == 0 )
                vTokens->nSize--;
            // load them into the new array
            for ( i = 0; i < vTokens->nSize; i++ )
                Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
            continue;
        }
        // otherwise, load them and break
        for ( i = 0; i < vTokens->nSize; i++ )
            Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
        break;
    }
    return p->vNewTokens;
}